

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_suite.cpp
# Opt level: O2

void __thiscall parser_suite::test_scheme::test_method(test_scheme *this)

{
  view_type local_1f0;
  undefined8 *local_1e0;
  char *local_1d8;
  string_type local_1d0;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char input [10];
  char *local_140;
  char *local_138;
  undefined1 *local_130;
  undefined1 *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  parser parser;
  
  local_1f0.ptr_ = input;
  builtin_strncpy(input,"scheme://",10);
  local_1f0.len_ = strlen(local_1f0.ptr_);
  trial::url::basic_parser<char>::basic_parser(&parser,&local_1f0);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x22);
  local_1f0.len_ = local_1f0.len_ & 0xffffffffffffff00;
  local_1f0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = "";
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_168 = "";
  trial::url::basic_parser<char>::scheme_abi_cxx11_(&local_1d0,&parser);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[7]>
            (&local_1f0,&local_170,0x22,2,2,&local_1d0,"parser.scheme()","scheme","\"scheme\"");
  std::__cxx11::string::~string((string *)&local_1d0);
  local_e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x23);
  local_1f0.len_ = local_1f0.len_ & 0xffffffffffffff00;
  local_1f0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = "";
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_178 = "";
  trial::url::basic_parser<char>::authority_abi_cxx11_(&local_1d0,&parser);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_1f0,&local_180,0x23,2,2,&local_1d0,"parser.authority()","","\"\"");
  std::__cxx11::string::~string((string *)&local_1d0);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x24);
  local_1f0.len_ = local_1f0.len_ & 0xffffffffffffff00;
  local_1f0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = "";
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_188 = "";
  trial::url::basic_parser<char>::path_abi_cxx11_(&local_1d0,&parser);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_1f0,&local_190,0x24,2,2,&local_1d0,"parser.path()","","\"\"");
  std::__cxx11::string::~string((string *)&local_1d0);
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_118 = "";
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  local_128 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_120,0x25);
  local_1f0.len_ = local_1f0.len_ & 0xffffffffffffff00;
  local_1f0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = "";
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_198 = "";
  trial::url::basic_parser<char>::query_abi_cxx11_(&local_1d0,&parser);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_1f0,&local_1a0,0x25,2,2,&local_1d0,"parser.query()","","\"\"");
  std::__cxx11::string::~string((string *)&local_1d0);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_138 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x26);
  local_1f0.len_ = local_1f0.len_ & 0xffffffffffffff00;
  local_1f0.ptr_ = (char *)&PTR__lazy_ostream_0016c290;
  local_1e0 = &boost::unit_test::lazy_ostream::inst;
  local_1d8 = "";
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/breese[P]trial/test/parser_suite.cpp";
  local_1a8 = "";
  trial::url::basic_parser<char>::fragment_abi_cxx11_(&local_1d0,&parser);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[1]>
            (&local_1f0,&local_1b0,0x26,2,2,&local_1d0,"parser.fragment()","","\"\"");
  std::__cxx11::string::~string((string *)&local_1d0);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_scheme)
{
    const char input[] = "scheme://";
    url::parser parser(input);
    BOOST_REQUIRE_EQUAL(parser.scheme(), "scheme");
    BOOST_REQUIRE_EQUAL(parser.authority(), "");
    BOOST_REQUIRE_EQUAL(parser.path(), "");
    BOOST_REQUIRE_EQUAL(parser.query(), "");
    BOOST_REQUIRE_EQUAL(parser.fragment(), "");
}